

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bilateral_filter.hpp
# Opt level: O3

void MeanField::Filtering::applyBilateralKernelY
               (float *input,float *output,uchar *rgb,float *spatialKernel,float *intensityKernel,
               float spatialSD,float intensitySD,int dim,int x,int y,int W,int H)

{
  long lVar1;
  int iVar2;
  void *__s;
  int iVar3;
  long lVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  int i;
  long lVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  uVar7 = (ulong)(uint)dim;
  uVar9 = 0xffffffffffffffff;
  if (-1 < dim) {
    uVar9 = uVar7 * 4;
  }
  __s = operator_new__(uVar9);
  if (0 < dim) {
    memset(__s,0,uVar7 * 4);
  }
  fVar10 = spatialSD;
  if (spatialSD <= intensitySD) {
    fVar10 = intensitySD;
  }
  iVar2 = (int)fVar10;
  if (-1 < iVar2) {
    lVar5 = (long)W;
    iVar3 = W * y + x;
    lVar1 = (long)iVar3 * 3;
    lVar4 = (long)-iVar2;
    pfVar6 = input + (((long)y - (long)iVar2) * lVar5 + (long)x) * (long)dim;
    fVar10 = 0.0;
    do {
      lVar8 = lVar4 + y;
      if (lVar8 < H && -1 < lVar8) {
        fVar13 = (float)(int)lVar4;
        fVar11 = 1.0;
        if ((-spatialSD <= fVar13) && (fVar11 = 1.0, fVar13 <= spatialSD)) {
          fVar11 = spatialKernel[(int)ABS(fVar13)];
        }
        fVar12 = 1.0;
        if ((-intensitySD <= fVar13) && (fVar12 = 1.0, fVar13 <= intensitySD)) {
          lVar8 = (lVar8 * lVar5 + (long)x) * 3;
          fVar12 = intensityKernel
                   [(int)ABS((float)(*(ushort *)(rgb + lVar8) & 0xff) -
                             (float)(*(ushort *)(rgb + lVar1) & 0xff))] *
                   intensityKernel
                   [(int)ABS((float)(byte)(*(ushort *)(rgb + lVar8) >> 8) -
                             (float)(byte)(*(ushort *)(rgb + lVar1) >> 8))] *
                   intensityKernel[(int)ABS((float)rgb[lVar8 + 2] - (float)rgb[lVar1 + 2])];
        }
        fVar10 = fVar10 + fVar11 * fVar12;
        if (0 < dim) {
          uVar9 = 0;
          do {
            *(float *)((long)__s + uVar9 * 4) =
                 pfVar6[uVar9] * fVar11 * fVar12 + *(float *)((long)__s + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar7 != uVar9);
        }
      }
      lVar4 = lVar4 + 1;
      pfVar6 = pfVar6 + dim * lVar5;
    } while (iVar2 + 1 != (int)lVar4);
    if (0.0 < fVar10 && 0 < dim) {
      uVar9 = 0;
      do {
        output[(long)(iVar3 * dim) + uVar9] = *(float *)((long)__s + uVar9 * 4) / fVar10;
        uVar9 = uVar9 + 1;
      } while (uVar7 != uVar9);
    }
  }
  operator_delete__(__s);
  return;
}

Assistant:

__SHARED_CODE__
            inline void applyBilateralKernelY(const float *input, float *output, const unsigned char *rgb, const float *spatialKernel,
                const float *intensityKernel, float spatialSD, float intensitySD, int dim, int x, int y, int W, int H) {
            float *channelSums = new float[dim];
            for (int i = 0; i < dim; i++) {
                channelSums[i] = 0.0;
            }

            int rad = (spatialSD > intensitySD) ? static_cast<int>(spatialSD) : static_cast<int>(intensitySD);
            float normaliser = 0.0;
            for (int r = -rad; r <= rad; r++) {
                int idx = y + r;
                if (idx < 0 || idx >= H) {
                    continue;
                }

                int pixelIdx = 3 * (y*W + x);
                int neighPixelIdx = 3 * (idx*W + x);

                float spatialFactor = 1.0;
                if (r >= -spatialSD && r <= spatialSD) {
                    spatialFactor = spatialKernel[static_cast<int>(fabs(static_cast<float>(r)))];
                }

                float intensityFactor = 1.0;
                if (r >= -intensitySD && r <= intensitySD) {
                    intensityFactor = intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx]) - static_cast<float>(rgb[pixelIdx])))] *//R
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 1]) - static_cast<float>(rgb[pixelIdx + 1])))] *//G
                        intensityKernel[static_cast<int>(fabs(static_cast<float>(rgb[neighPixelIdx + 2]) - static_cast<float>(rgb[pixelIdx + 2])))];//B
                }

                normaliser += spatialFactor * intensityFactor;
                for (int i = 0; i < dim; i++) {
                    channelSums[i] += input[(idx*W + x)*dim + i] * spatialFactor*intensityFactor;
                }
            }

            if (normaliser > 0.0) {
                for (int i = 0; i < dim; i++) {
                    output[(y*W + x)*dim + i] = channelSums[i] / normaliser;
                }
            }

            delete[] channelSums;
        }